

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenType BinaryenStructTypeGetFieldType(BinaryenHeapType heapType,BinaryenIndex index)

{
  pointer pFVar1;
  bool bVar2;
  Struct *pSVar3;
  HeapType local_18;
  HeapType ht;
  
  local_18.id = heapType;
  bVar2 = wasm::HeapType::isStruct(&local_18);
  if (!bVar2) {
    __assert_fail("ht.isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x149,
                  "BinaryenType BinaryenStructTypeGetFieldType(BinaryenHeapType, BinaryenIndex)");
  }
  pSVar3 = wasm::HeapType::getStruct(&local_18);
  pFVar1 = (pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)index <
      (ulong)((long)(pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4)) {
    return pFVar1[index].type.id;
  }
  __assert_fail("index < fields.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x14b,
                "BinaryenType BinaryenStructTypeGetFieldType(BinaryenHeapType, BinaryenIndex)");
}

Assistant:

BinaryenType BinaryenStructTypeGetFieldType(BinaryenHeapType heapType,
                                            BinaryenIndex index) {
  auto ht = HeapType(heapType);
  assert(ht.isStruct());
  auto& fields = ht.getStruct().fields;
  assert(index < fields.size());
  return fields[index].type.getID();
}